

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

bool __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
multiple_select_enabled
          (list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = (this->super_scrollable_region).super_drawable.m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  bVar1 = this->ms_enabled;
  auto_mutex::unlock(&local_28);
  return bVar1;
}

Assistant:

bool list_box<S>::
    multiple_select_enabled (
    ) const
    {
        auto_mutex M(m);
        return ms_enabled;
    }